

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

void __thiscall httplib::ThreadPool::worker::operator()(worker *this)

{
  condition_variable *pcVar1;
  bool bVar2;
  bool bVar3;
  ThreadPool *pTVar4;
  unique_lock<std::mutex> lock;
  function<void_()> fn;
  unique_lock<std::mutex> local_58;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  do {
    local_38 = (code *)0x0;
    pcStack_30 = (code *)0x0;
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_58._M_device = &this->pool_->mutex_;
    local_58._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_58);
    local_58._M_owns = true;
    pTVar4 = this->pool_;
    if ((pTVar4->jobs_).
        super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
        _M_node.super__List_node_base._M_next == (_List_node_base *)&pTVar4->jobs_) {
      pcVar1 = &pTVar4->cond_;
      do {
        if (pTVar4->shutdown_ != false) break;
        std::condition_variable::wait((unique_lock *)pcVar1);
        pTVar4 = this->pool_;
      } while ((pTVar4->jobs_).
               super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
               _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&pTVar4->jobs_);
    }
    pTVar4 = this->pool_;
    if ((pTVar4->shutdown_ == true) &&
       ((pTVar4->jobs_).
        super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
        _M_node.super__List_node_base._M_next == (_List_node_base *)&pTVar4->jobs_)) {
      bVar3 = true;
      bVar2 = false;
    }
    else {
      std::function<void_()>::operator=
                ((function<void_()> *)&local_48,
                 (function<void_()> *)
                 ((pTVar4->jobs_).
                  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next + 1));
      std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::_M_erase
                (&this->pool_->jobs_,
                 (this->pool_->jobs_).
                 super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
                 _M_impl._M_node.super__List_node_base._M_next);
      bVar3 = false;
      bVar2 = true;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_58);
    if (bVar2) {
      if (local_38 == (code *)0x0) {
        __assert_fail("true == static_cast<bool>(fn)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/deps/cpp-httplib/httplib.h"
                      ,0x1c1,"void httplib::ThreadPool::worker::operator()()");
      }
      bVar3 = false;
      (*pcStack_30)(&local_48);
    }
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    if (bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void operator()() {
      for (;;) {
        std::function<void()> fn;
        {
          std::unique_lock<std::mutex> lock(pool_.mutex_);

          pool_.cond_.wait(
              lock, [&] { return !pool_.jobs_.empty() || pool_.shutdown_; });

          if (pool_.shutdown_ && pool_.jobs_.empty()) { break; }

          fn = pool_.jobs_.front();
          pool_.jobs_.pop_front();
        }

        assert(true == static_cast<bool>(fn));
        fn();
      }
    }